

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O1

bid_t docio_append_doc(docio_handle *handle,docio_object *doc,uint8_t deleted,uint8_t txn_enabled)

{
  uint8_t uVar1;
  bid_t bVar2;
  uint8_t uVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  
  uVar1 = ((int)CONCAT71(in_register_00000011,deleted) != 0) * '\x04';
  uVar3 = uVar1 + '\b';
  if ((int)CONCAT71(in_register_00000009,txn_enabled) == 0) {
    uVar3 = uVar1;
  }
  (doc->length).flag = uVar3;
  bVar2 = _docio_append_doc(handle,doc);
  return bVar2;
}

Assistant:

bid_t docio_append_doc(struct docio_handle *handle, struct docio_object *doc,
                       uint8_t deleted, uint8_t txn_enabled)
{
    doc->length.flag = DOCIO_NORMAL;
    if (deleted) {
        doc->length.flag |= DOCIO_DELETED;
    }
    if (txn_enabled) {
        doc->length.flag |= DOCIO_TXN_DIRTY;
    }
    return _docio_append_doc(handle, doc);
}